

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DisableIffSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableIffSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax *args_3,
          Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  DisableIffSyntax *pDVar21;
  
  pDVar21 = (DisableIffSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DisableIffSyntax *)this->endPtr < pDVar21 + 1) {
    pDVar21 = (DisableIffSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pDVar21 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar1 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar17 = args_4->kind;
  uVar18 = args_4->field_0x2;
  NVar19.raw = (args_4->numFlags).raw;
  uVar20 = args_4->rawLen;
  pIVar4 = args_4->info;
  (pDVar21->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pDVar21->super_SyntaxNode).kind = DisableIff;
  (pDVar21->disable).kind = TVar5;
  (pDVar21->disable).field_0x2 = uVar6;
  (pDVar21->disable).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar21->disable).rawLen = uVar8;
  (pDVar21->disable).info = pIVar1;
  (pDVar21->iff).kind = TVar9;
  (pDVar21->iff).field_0x2 = uVar10;
  (pDVar21->iff).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar21->iff).rawLen = uVar12;
  (pDVar21->iff).info = pIVar2;
  (pDVar21->openParen).kind = TVar13;
  (pDVar21->openParen).field_0x2 = uVar14;
  (pDVar21->openParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (pDVar21->openParen).rawLen = uVar16;
  (pDVar21->openParen).info = pIVar3;
  (pDVar21->expr).ptr = args_3;
  (pDVar21->closeParen).kind = TVar17;
  (pDVar21->closeParen).field_0x2 = uVar18;
  (pDVar21->closeParen).numFlags = (NumericTokenFlags)NVar19.raw;
  (pDVar21->closeParen).rawLen = uVar20;
  (pDVar21->closeParen).info = pIVar4;
  (args_3->super_SyntaxNode).parent = &pDVar21->super_SyntaxNode;
  return pDVar21;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }